

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O2

uint64_t helper_iwmmxt_packsw_arm(CPUARMState *env,uint64_t a,uint64_t b)

{
  ulong uVar1;
  
  uVar1 = b << 8 & 0xff00000000000000 |
          (ulong)((uint)(a >> 0x18) & 0xff000000) |
          a >> 0x10 & 0xff0000 | (ulong)((uint)(a >> 8) & 0xff00) | (b & 0xff00000000) << 0x10;
  (env->iwmmxt).cregs[3] =
       (uint)b & 0x800000 | (uint)((a & 0xff000000000000) == 0) << 0xe | (uint)(a >> 0x28) & 0x8000
       | ((uint)b & 0x80) << 0xc | (uint)((char)b == '\0') << 0x12 |
       (uint)((b & 0xff0000) == 0) << 0x16 |
       (uint)((char)(a >> 0x20) == '\0') << 10 |
       (uint)(a >> 0x1c) & 0x800 |
       (uint)((a & 0xff0000) == 0) << 6 |
       (uint)(a >> 0x10) & 0x80 | ((uint)(a >> 4) & 8) + (uint)((a & 0xff) == 0) * 4 |
       (uint)((b << 8) >> 0x38 == 0) << 0x1e | (uint)(uVar1 >> 0x1c) & 0x8000000 |
       (uint)((b & 0xff00000000) == 0) << 0x1a | (uint)(b >> 0x18) & 0x80000000;
  return (b & 0xff0000) << 0x18 | (b & 0xff) << 0x20 | uVar1 | a & 0xff;
}

Assistant:

uint64_t HELPER(iwmmxt_packsw)(CPUARMState *env, uint64_t a, uint64_t b)
{
    a = (((a >> 0) & 0xff) << 0) | (((a >> 16) & 0xff) << 8) |
        (((a >> 32) & 0xff) << 16) | (((a >> 48) & 0xff) << 24) |
        (((b >> 0) & 0xff) << 32) | (((b >> 16) & 0xff) << 40) |
        (((b >> 32) & 0xff) << 48) | (((b >> 48) & 0xff) << 56);
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT8(a >> 0, 0) | NZBIT8(a >> 8, 1) |
        NZBIT8(a >> 16, 2) | NZBIT8(a >> 24, 3) |
        NZBIT8(a >> 32, 4) | NZBIT8(a >> 40, 5) |
        NZBIT8(a >> 48, 6) | NZBIT8(a >> 56, 7);
    return a;
}